

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_MetadataString
          (X3DExporter *this,aiString *pKey,aiString *pValue,size_t pTabLevel)

{
  pointer pcVar1;
  _Node *p_Var2;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator local_81;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_80;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80._M_impl._M_node._M_size = 0;
  pcVar1 = local_68 + 0x10;
  local_80._M_impl._M_node.super__List_node_base._M_prev =
       local_80._M_impl._M_node.super__List_node_base._M_next;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"name","");
  std::__cxx11::string::string((string *)&local_48,pKey->data,&local_81);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_80,(SAttribute *)local_68);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"value","");
  std::__cxx11::string::string((string *)&local_48,pValue->data,&local_81);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_80,(SAttribute *)local_68);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"MetadataString","");
  NodeHelper_OpenNode(this,(string *)local_68,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_80);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_80);
  return;
}

Assistant:

void X3DExporter::Export_MetadataString(const aiString& pKey, const aiString& pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", pValue.C_Str()});
	NodeHelper_OpenNode("MetadataString", pTabLevel, true, attr_list);
}